

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

Matrix<double,__1,__1> __thiscall
Matrix<double,-1,-1>::operator*(Matrix<double,_1,_1> *this,Matrix<double,__1,__1> *matrix)

{
  double dVar1;
  int iVar2;
  int iVar3;
  ostream *this_00;
  double *pdVar4;
  int local_3c;
  double dStack_38;
  int j;
  double sum;
  int k;
  int i;
  Matrix<double,__1,__1> *matrix_local;
  Matrix<double,__1,__1> *this_local;
  Matrix<double,__1,__1> result_;
  
  iVar2 = Matrix<double,_-1,_-1>::row(matrix);
  iVar3 = Matrix<double,_-1,_-1>::col((Matrix<double,__1,__1> *)this);
  if (iVar2 != iVar3) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "you can not mutiply two matrix which the col of the first does not match the row of the second"
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  Matrix<double,_-1,_-1>::Matrix((Matrix<double,__1,__1> *)&this_local);
  iVar2 = Matrix<double,_-1,_-1>::row((Matrix<double,__1,__1> *)&this_local);
  if (iVar2 == -1) {
    iVar2 = Matrix<double,_-1,_-1>::row((Matrix<double,__1,__1> *)this);
    iVar3 = Matrix<double,_-1,_-1>::col(matrix);
    Matrix<double,_-1,_-1>::resize((Matrix<double,__1,__1> *)&this_local,iVar2,iVar3);
  }
  sum._4_4_ = 0;
  while( true ) {
    iVar2 = Matrix<double,_-1,_-1>::row((Matrix<double,__1,__1> *)this);
    if (iVar2 <= sum._4_4_) break;
    sum._0_4_ = 0;
    while( true ) {
      iVar2 = Matrix<double,_-1,_-1>::col(matrix);
      if (iVar2 <= sum._0_4_) break;
      dStack_38 = 0.0;
      local_3c = 0;
      while( true ) {
        iVar2 = Matrix<double,_-1,_-1>::col((Matrix<double,__1,__1> *)this);
        if (iVar2 <= local_3c) break;
        pdVar4 = Matrix<double,_-1,_-1>::operator()
                           ((Matrix<double,__1,__1> *)this,sum._4_4_,local_3c);
        dVar1 = *pdVar4;
        pdVar4 = Matrix<double,_-1,_-1>::operator()(matrix,local_3c,sum._0_4_);
        dStack_38 = dVar1 * *pdVar4 + dStack_38;
        local_3c = local_3c + 1;
      }
      Matrix<double,_-1,_-1>::SetElement
                ((Matrix<double,__1,__1> *)&this_local,sum._4_4_,sum._0_4_,dStack_38);
      sum._0_4_ = sum._0_4_ + 1;
    }
    sum._4_4_ = sum._4_4_ + 1;
  }
  return _this_local;
}

Assistant:

Matrix<Type, _0, _2> Matrix<Type, _0, _1>::operator*(const Matrix<Type, _1, _2> &matrix)
{
    if(matrix.row() != this->col())
    {
        cerr << "you can not mutiply two matrix which the col of the first does not match the row of the second" << endl;
        exit(-1);
    }
    Matrix<Type, _0, _2> result_;
    if(result_.row() == Dynamic)
        result_.resize(this->row(), matrix.col());

    for(int i = 0; i < this->row(); ++i)
    {
        for (int k = 0; k < matrix.col(); ++k)
        {
            Type sum = 0;
            for (int j = 0; j < this->col(); ++j)
            {
                sum = sum + this->operator()(i, j) * matrix(j, k);
            }
            result_.SetElement(i, k, sum);
        }
    }
    return result_;
}